

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::decodeDouble(OurReader *this,Token *token)

{
  bool bVar1;
  Value *pVVar2;
  undefined1 local_48 [8];
  Value decoded;
  Token *token_local;
  OurReader *this_local;
  
  decoded.limit_ = (ptrdiff_t)token;
  Value::Value((Value *)local_48,nullValue);
  bVar1 = decodeDouble(this,(Token *)decoded.limit_,(Value *)local_48);
  if (bVar1) {
    pVVar2 = currentValue(this);
    Value::swapPayload(pVVar2,(Value *)local_48);
    pVVar2 = currentValue(this);
    Value::setOffsetStart(pVVar2,*(long *)(decoded.limit_ + 8) - (long)this->begin_);
    pVVar2 = currentValue(this);
    Value::setOffsetLimit(pVVar2,*(long *)(decoded.limit_ + 0x10) - (long)this->begin_);
  }
  Value::~Value((Value *)local_48);
  return bVar1;
}

Assistant:

bool OurReader::decodeDouble(Token& token) {
  Value decoded;
  if (!decodeDouble(token, decoded))
    return false;
  currentValue().swapPayload(decoded);
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}